

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_30 [40];
  AssertionPrinter *this_local;
  
  local_30._32_8_ = this;
  bVar1 = AssertionResult::hasExpression(this->result);
  if (bVar1) {
    poVar2 = std::operator<<(this->stream," ");
    AssertionResult::getExpression_abi_cxx11_((AssertionResult *)local_30);
    std::operator<<(poVar2,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if( result.hasExpression() ) {
                    stream << " " << result.getExpression();
                }
            }